

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreFactory.cpp
# Opt level: O0

void helics::CoreFactory::abortAllCores(int errorCode,string_view errorString)

{
  milliseconds delay;
  bool bVar1;
  element_type *peVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *x;
  uint in_EDI;
  __sv_type _Var3;
  shared_ptr<helics::Core> *core;
  iterator __end2;
  iterator __begin2;
  vector<std::shared_ptr<helics::Core>,_std::allocator<std::shared_ptr<helics::Core>_>_> *__range2;
  vector<std::shared_ptr<helics::Core>,_std::allocator<std::shared_ptr<helics::Core>_>_> cores;
  undefined1 in_stack_00000120 [16];
  undefined1 in_stack_00000130 [16];
  vector<std::shared_ptr<helics::Core>,_std::allocator<std::shared_ptr<helics::Core>_>_>
  *in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffec0;
  uint in_stack_fffffffffffffec4;
  undefined4 in_stack_fffffffffffffed0;
  int in_stack_fffffffffffffed4;
  int iVar4;
  duration<long,std::ratio<1l,1000l>> local_128 [24];
  char *local_110;
  undefined8 local_108;
  undefined1 local_100 [8];
  SearchableObjectHolder<helics::Core,_helics::CoreType> *in_stack_ffffffffffffff08;
  size_t local_e0;
  char *local_d8;
  __normal_iterator<std::shared_ptr<helics::Core>_*,_std::vector<std::shared_ptr<helics::Core>,_std::allocator<std::shared_ptr<helics::Core>_>_>_>
  local_b8;
  undefined1 *local_b0;
  undefined1 local_a8 [28];
  uint local_8c;
  undefined1 local_88 [16];
  undefined1 local_78 [32];
  undefined8 local_58;
  undefined1 *local_50;
  char *local_48;
  undefined8 uStack_40;
  undefined1 *local_38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_30;
  char *local_28;
  undefined8 uStack_20;
  undefined1 *local_18;
  undefined1 *local_10;
  undefined8 *local_8;
  undefined4 extraout_var;
  
  local_8c = in_EDI;
  gmlc::concurrency::SearchableObjectHolder<helics::Core,_helics::CoreType>::getObjects
            (in_stack_ffffffffffffff08);
  local_b0 = local_a8;
  local_b8._M_current =
       (shared_ptr<helics::Core> *)
       std::vector<std::shared_ptr<helics::Core>,_std::allocator<std::shared_ptr<helics::Core>_>_>::
       begin(in_stack_fffffffffffffeb8);
  std::vector<std::shared_ptr<helics::Core>,_std::allocator<std::shared_ptr<helics::Core>_>_>::end
            (in_stack_fffffffffffffeb8);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<std::shared_ptr<helics::Core>_*,_std::vector<std::shared_ptr<helics::Core>,_std::allocator<std::shared_ptr<helics::Core>_>_>_>
                      ((__normal_iterator<std::shared_ptr<helics::Core>_*,_std::vector<std::shared_ptr<helics::Core>,_std::allocator<std::shared_ptr<helics::Core>_>_>_>
                        *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                       (__normal_iterator<std::shared_ptr<helics::Core>_*,_std::vector<std::shared_ptr<helics::Core>,_std::allocator<std::shared_ptr<helics::Core>_>_>_>
                        *)in_stack_fffffffffffffeb8);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<helics::Core>_*,_std::vector<std::shared_ptr<helics::Core>,_std::allocator<std::shared_ptr<helics::Core>_>_>_>
    ::operator*(&local_b8);
    in_stack_fffffffffffffeb8 =
         (vector<std::shared_ptr<helics::Core>,_std::allocator<std::shared_ptr<helics::Core>_>_> *)
         std::__shared_ptr_access<helics::Core,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
         operator->((__shared_ptr_access<helics::Core,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                    0x513aae);
    local_110 = "{} sent abort message: \'{}\'";
    local_108 = 0x1b;
    in_stack_fffffffffffffec4 = local_8c;
    peVar2 = std::__shared_ptr_access<helics::Core,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<helics::Core,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x513ae7);
    iVar4 = (*peVar2->_vptr_Core[0xc])();
    x = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        CONCAT44(extraout_var,iVar4);
    local_18 = local_100;
    local_28 = local_110;
    uStack_20 = local_108;
    local_38 = local_88;
    local_48 = local_110;
    uStack_40 = local_108;
    local_30 = x;
    ::fmt::v11::detail::value<fmt::v11::context>::
    value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_0>
              ((value<fmt::v11::context> *)
               CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),x);
    ::fmt::v11::detail::value<fmt::v11::context>::
    value<std::basic_string_view<char,_std::char_traits<char>_>,_char,_0>
              ((value<fmt::v11::context> *)
               CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
               (basic_string_view<char,_std::char_traits<char>_> *)x);
    local_8 = &local_58;
    local_10 = local_78;
    local_58 = 0xdd;
    local_50 = local_10;
    ::fmt::v11::vformat_abi_cxx11_((string_view)in_stack_00000130,(format_args)in_stack_00000120);
    _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
    local_e0 = _Var3._M_len;
    local_d8 = _Var3._M_str;
    (*(code *)(in_stack_fffffffffffffeb8->
              super__Vector_base<std::shared_ptr<helics::Core>,_std::allocator<std::shared_ptr<helics::Core>_>_>
              )._M_impl.super__Vector_impl_data._M_start[7].
              super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
              (in_stack_fffffffffffffeb8,0xfffffefd,(ulong)in_stack_fffffffffffffec4,local_e0,
               local_d8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
    peVar2 = std::__shared_ptr_access<helics::Core,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<helics::Core,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x513c37);
    (*peVar2->_vptr_Core[8])();
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<helics::Core>_*,_std::vector<std::shared_ptr<helics::Core>,_std::allocator<std::shared_ptr<helics::Core>_>_>_>
    ::operator++(&local_b8);
  }
  iVar4 = 0xfa;
  std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
            (local_128,(int *)&stack0xfffffffffffffed4);
  delay.__r._4_4_ = in_stack_fffffffffffffec4;
  delay.__r._0_4_ = in_stack_fffffffffffffec0;
  cleanUpCores(delay);
  std::vector<std::shared_ptr<helics::Core>,_std::allocator<std::shared_ptr<helics::Core>_>_>::
  ~vector((vector<std::shared_ptr<helics::Core>,_std::allocator<std::shared_ptr<helics::Core>_>_> *)
          CONCAT44(iVar4,in_stack_fffffffffffffed0));
  return;
}

Assistant:

void abortAllCores(int errorCode, std::string_view errorString)
{
    auto cores = searchableCores.getObjects();
    for (auto& core : cores) {
        core->globalError(gLocalCoreId,
                          errorCode,
                          fmt::format("{} sent abort message: '{}'",
                                      core->getIdentifier(),
                                      errorString));

        core->disconnect();
    }
    cleanUpCores(std::chrono::milliseconds(250));
}